

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
SimpleStringBuffer::addMemoryDump(SimpleStringBuffer *this,void *memory,size_t memorySize)

{
  char local_51;
  char toAdd;
  size_t leftoverBytes;
  size_t bytesInLine;
  size_t p;
  size_t currentPos;
  size_t maxLineBytes;
  uchar *byteMemory;
  size_t memorySize_local;
  void *memory_local;
  SimpleStringBuffer *this_local;
  
  for (p = 0; p < memorySize; p = leftoverBytes + p) {
    add(this,"    %04lx: ",p);
    leftoverBytes = memorySize - p;
    if (0x10 < leftoverBytes) {
      leftoverBytes = 0x10;
    }
    for (bytesInLine = 0; bytesInLine < leftoverBytes; bytesInLine = bytesInLine + 1) {
      add(this,"%02hx ",(ulong)*(byte *)((long)memory + p + bytesInLine));
      if (bytesInLine == 7) {
        add(this," ");
      }
    }
    for (bytesInLine = 0; bytesInLine < 0x10 - leftoverBytes; bytesInLine = bytesInLine + 1) {
      add(this,"   ");
    }
    if (8 < 0x10 - leftoverBytes) {
      add(this," ");
    }
    add(this,"|");
    for (bytesInLine = 0; bytesInLine < leftoverBytes; bytesInLine = bytesInLine + 1) {
      local_51 = *(char *)((long)memory + p + bytesInLine);
      if ((local_51 < ' ') || ('~' < local_51)) {
        local_51 = '.';
      }
      add(this,"%c",(ulong)(uint)(int)local_51);
    }
    add(this,"|\n");
  }
  return;
}

Assistant:

void SimpleStringBuffer::addMemoryDump(const void* memory, size_t memorySize)
{
    const unsigned char* byteMemory = (const unsigned char*)memory;
    const size_t maxLineBytes = 16;
    size_t currentPos = 0;
    size_t p;

    while (currentPos < memorySize) {
        add("    %04lx: ", (unsigned long) currentPos);
        size_t bytesInLine = memorySize - currentPos;
        if (bytesInLine > maxLineBytes) {
            bytesInLine = maxLineBytes;
        }
        const size_t leftoverBytes = maxLineBytes - bytesInLine;

        for (p = 0; p < bytesInLine; p++) {
            add("%02hx ", (unsigned short) byteMemory[currentPos + p]);
            if (p == ((maxLineBytes / 2) - 1)) {
                add(" ");
            }
        }
        for (p = 0; p < leftoverBytes; p++) {
            add("   ");
        }
        if (leftoverBytes > (maxLineBytes/2)) {
            add(" ");
        }

        add("|");
        for (p = 0; p < bytesInLine; p++) {
            char toAdd = (char)byteMemory[currentPos + p];
            if (toAdd < ' ' || toAdd > '~') {
                toAdd = '.';
            }
            add("%c", (int)toAdd);
        }
        add("|\n");
        currentPos += bytesInLine;
    }
}